

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O2

void __thiscall
duckdb_shell::ModeHtmlRenderer::RenderHeader(ModeHtmlRenderer *this,RowResult *result)

{
  ShellState *this_00;
  idx_t i;
  ulong uVar1;
  
  if ((this->super_RowRenderer).super_ShellRenderer.show_header == true) {
    ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,"<tr>");
    for (uVar1 = 0; this_00 = (this->super_RowRenderer).super_ShellRenderer.state,
        uVar1 < (ulong)((long)(result->column_names).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(result->column_names).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
      ShellState::Print(this_00,"<th>");
      output_html_string(this,(result->column_names).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar1]);
      ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,"</th>\n");
    }
    ShellState::Print(this_00,"</tr>\n");
    return;
  }
  return;
}

Assistant:

void RenderHeader(RowResult &result) override {
		if (!show_header) {
			return;
		}
		auto &col_names = result.column_names;
		state.Print("<tr>");
		for (idx_t i = 0; i < col_names.size(); i++) {
			state.Print("<th>");
			output_html_string(col_names[i]);
			state.Print("</th>\n");
		}
		state.Print("</tr>\n");
	}